

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
RtApi::getDeviceIds(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   RtApi *this)

{
  pointer pDVar1;
  uint uVar2;
  
  (*this->_vptr_RtApi[0xb])(this);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    pDVar1 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->deviceList_).
                       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60) <=
        (ulong)uVar2) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&pDVar1[uVar2].ID);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> RtApi :: getDeviceIds( void )
{
  probeDevices();

  // Copy device IDs into output vector.
  std::vector<unsigned int> deviceIds;
  for ( unsigned int m=0; m<deviceList_.size(); m++ )
    deviceIds.push_back( deviceList_[m].ID );

  return deviceIds;
}